

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesQueueBindSparseTests.cpp
# Opt level: O3

void vkt::sparse::anon_unknown_2::populateTestGroup(TestCaseGroup *group)

{
  TestContext *pTVar1;
  TestNode *node;
  long *plVar2;
  long lVar3;
  undefined8 auStack_608 [4];
  undefined8 auStack_5e8 [2];
  undefined1 *local_5d8 [2];
  undefined1 local_5c8 [16];
  undefined4 local_5b8;
  undefined8 local_5b4;
  undefined2 local_5ac;
  undefined1 *local_5a8 [2];
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  undefined4 local_568;
  undefined8 local_564;
  undefined2 local_55c;
  undefined1 *local_558 [2];
  undefined1 local_548 [16];
  undefined1 *local_538 [2];
  undefined1 local_528 [16];
  undefined8 local_518;
  undefined4 local_510;
  undefined2 local_50c;
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined8 local_4c8;
  undefined4 local_4c0;
  undefined2 local_4bc;
  undefined1 *local_4b8 [2];
  undefined1 local_4a8 [16];
  undefined1 *local_498 [2];
  undefined1 local_488 [16];
  undefined8 local_478;
  undefined4 local_470;
  undefined2 local_46c;
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined8 local_428;
  undefined4 local_420;
  undefined2 local_41c;
  undefined1 *local_418 [2];
  undefined1 local_408 [16];
  undefined1 *local_3f8 [2];
  undefined1 local_3e8 [16];
  undefined8 local_3d8;
  undefined4 local_3d0;
  undefined2 local_3cc;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined8 local_388;
  undefined4 local_380;
  undefined2 local_37c;
  undefined1 *local_378 [2];
  undefined1 local_368 [16];
  undefined1 *local_358 [2];
  undefined1 local_348 [16];
  undefined8 local_338;
  undefined4 local_330;
  undefined2 local_32c;
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined8 local_2e8;
  undefined4 local_2e0;
  undefined2 local_2dc;
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined4 local_290;
  undefined2 local_28c;
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined8 local_248;
  undefined4 local_240;
  undefined2 local_23c;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined2 local_1ec;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined4 local_1a0;
  undefined2 local_19c;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined4 local_150;
  undefined2 local_14c;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined4 local_100;
  undefined2 local_fc;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined4 local_b0;
  undefined2 local_ac;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined4 local_60;
  undefined2 local_5c;
  long *local_58 [2];
  long local_48 [3];
  
  local_5d8[0] = local_5c8;
  auStack_5e8[1] = 0x760895;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"no_dependency","");
  local_5b8 = 1;
  local_5a8[0] = local_598;
  local_5b4 = 0;
  local_5ac = 0;
  auStack_5e8[1] = 0x7608cb;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5a8,"submit without any semaphores","");
  local_588[0] = local_578;
  auStack_5e8[1] = 0x7608f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"no_dependency_fence","");
  local_568 = 1;
  local_564 = 0;
  local_55c = 0x100;
  local_558[0] = local_548;
  auStack_5e8[1] = 0x76092c;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_558,"submit without any semaphores, signal a fence","");
  local_538[0] = local_528;
  auStack_5e8[1] = 0x760956;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"single_queue_wait_one","");
  local_518 = 0x100000001;
  local_510 = 0;
  local_50c = 0x100;
  local_508[0] = local_4f8;
  auStack_5e8[1] = 0x760998;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_508,"only sparse queue, wait for semaphore(s)","");
  local_4e8[0] = local_4d8;
  auStack_5e8[1] = 0x7609c2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"single_queue_wait_many","");
  local_4c8 = 0x300000001;
  local_4c0 = 0;
  local_4bc = 0x100;
  local_4b8[0] = local_4a8;
  auStack_5e8[1] = 0x760a04;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b8,"only sparse queue, wait for semaphore(s)","");
  local_498[0] = local_488;
  auStack_5e8[1] = 0x760a2e;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"single_queue_signal_one","");
  local_478 = 1;
  local_470 = 1;
  local_46c = 0x100;
  local_468[0] = local_458;
  auStack_5e8[1] = 0x760a6a;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,"only sparse queue, signal semaphore(s)","");
  local_448[0] = local_438;
  auStack_5e8[1] = 0x760a94;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"single_queue_signal_many","")
  ;
  local_428 = 1;
  local_420 = 3;
  local_41c = 0x100;
  local_418[0] = local_408;
  auStack_5e8[1] = 0x760ad0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_418,"only sparse queue, signal semaphore(s)","");
  local_3f8[0] = local_3e8;
  auStack_5e8[1] = 0x760afa;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,"single_queue_wait_one_signal_one","");
  local_3d8 = 0x100000001;
  local_3d0 = 1;
  local_3cc = 0x100;
  local_3c8[0] = local_3b8;
  auStack_5e8[1] = 0x760b32;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c8,"only sparse queue, wait for and signal semaphore(s)","");
  local_3a8[0] = local_398;
  auStack_5e8[1] = 0x760b5d;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a8,"single_queue_wait_many_signal_many","");
  local_388 = 0x200000001;
  local_380 = 3;
  local_37c = 0x100;
  local_378[0] = local_368;
  auStack_5e8[1] = 0x760b9f;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_378,"only sparse queue, wait for and signal semaphore(s)","");
  local_358[0] = local_348;
  auStack_5e8[1] = 0x760bc9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"multi_queue_wait_one","");
  local_338 = 0x100000002;
  local_330 = 0;
  local_32c = 0x100;
  local_328[0] = local_318;
  auStack_5e8[1] = 0x760c0b;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"sparse and other queues, wait for semaphore(s)","");
  local_308[0] = local_2f8;
  auStack_5e8[1] = 0x760c35;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"multi_queue_wait_many","");
  local_2e8 = 0x200000002;
  local_2e0 = 0;
  local_2dc = 0x100;
  local_2d8[0] = local_2c8;
  auStack_5e8[1] = 0x760c77;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,"sparse and other queues, wait for semaphore(s)","");
  local_2b8[0] = local_2a8;
  auStack_5e8[1] = 0x760ca1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"multi_queue_signal_one","");
  local_298 = 2;
  local_290 = 1;
  local_28c = 0x100;
  local_288[0] = local_278;
  auStack_5e8[1] = 0x760cdd;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"sparse and other queues, signal semaphore(s)","");
  local_268[0] = local_258;
  auStack_5e8[1] = 0x760d07;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"multi_queue_signal_many","");
  local_248 = 2;
  local_240 = 2;
  local_23c = 0x100;
  local_238[0] = local_228;
  auStack_5e8[1] = 0x760d43;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"sparse and other queues, signal semaphore(s)","");
  local_218[0] = local_208;
  auStack_5e8[1] = 0x760d6d;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,"multi_queue_wait_one_signal_one","");
  local_1f8 = 0x100000002;
  local_1f0 = 1;
  local_1ec = 0x100;
  local_1e8[0] = local_1d8;
  auStack_5e8[1] = 0x760da5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"sparse and other queues, wait for and signal semaphore(s)","");
  local_1c8[0] = local_1b8;
  auStack_5e8[1] = 0x760dcf;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"multi_queue_wait_many_signal_many","");
  local_1a8 = 0x200000002;
  local_1a0 = 2;
  local_19c = 0x100;
  local_198[0] = local_188;
  auStack_5e8[1] = 0x760e07;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"sparse and other queues, wait for and signal semaphore(s)","");
  local_178[0] = local_168;
  auStack_5e8[1] = 0x760e31;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"multi_queue_wait_one_signal_one_other","");
  local_158 = 0x100000002;
  local_150 = 1;
  local_14c = 0x100;
  local_148[0] = local_138;
  auStack_5e8[1] = 0x760e69;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_148,
             "sparse and other queues, wait for and signal semaphore(s) on other queues","");
  local_128[0] = local_118;
  auStack_5e8[1] = 0x760e94;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"multi_queue_wait_many_signal_many_other","");
  local_108 = 0x200000003;
  local_100 = 2;
  local_fc = 0x100;
  local_f8[0] = local_e8;
  auStack_5e8[1] = 0x760ed6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,
             "sparse and other queues, wait for and signal semaphore(s) on other queues","");
  local_d8[0] = local_c8;
  auStack_5e8[1] = 0x760f01;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"empty","");
  local_b8 = 1;
  local_b0 = 0;
  local_ac = 1;
  local_a8[0] = local_98;
  auStack_5e8[1] = 0x760f3d;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"call vkQueueBindSparse with zero bindInfos","");
  local_88[0] = local_78;
  auStack_5e8[1] = 0x760f67;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"empty_fence","");
  local_68 = 1;
  local_60 = 0;
  local_5c = 0x101;
  plVar2 = local_48;
  auStack_5e8[1] = 0x760fa4;
  local_58[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"call vkQueueBindSparse with zero bindInfos, signal a fence","");
  lVar3 = 0x30;
  do {
    auStack_5e8[1] = 0x760fbb;
    node = (TestNode *)operator_new(0x80);
    auStack_5e8[1] = 0x760fd3;
    tcu::TestCase::TestCase
              ((TestCase *)node,(group->super_TestNode).m_testCtx,
               *(char **)((long)auStack_608 + lVar3),*(char **)((long)local_5d8 + lVar3));
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d34910;
    pTVar1 = *(TestContext **)((long)local_5d8 + lVar3 + -8);
    node[1]._vptr_TestNode = *(_func_int ***)((long)auStack_5e8 + lVar3);
    node[1].m_testCtx = pTVar1;
    auStack_5e8[1] = 0x760feb;
    tcu::TestNode::addChild(&group->super_TestNode,node);
    lVar3 = lVar3 + 0x50;
  } while (lVar3 != 0x5d0);
  lVar3 = -0x5a0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      auStack_5e8[1] = 0x761015;
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    if (plVar2 + -6 != (long *)plVar2[-8]) {
      auStack_5e8[1] = 0x76102f;
      operator_delete((long *)plVar2[-8],plVar2[-6] + 1);
    }
    plVar2 = plVar2 + -10;
    lVar3 = lVar3 + 0x50;
  } while (lVar3 != 0);
  return;
}

Assistant:

void populateTestGroup(tcu::TestCaseGroup* group)
{
	const struct
	{
		std::string		name;
		TestParams		params;
		std::string		description;
	} cases[] =
	{
		// case name									// numQueues, numWaitSems, numSignalSems, emptySubmission, checkFence
		{ "no_dependency",								{	1u,	0u,	0u,	false,	false,	}, "submit without any semaphores", },
		{ "no_dependency_fence",						{	1u,	0u,	0u,	false,	true,	}, "submit without any semaphores, signal a fence", },

		{ "single_queue_wait_one",						{	1u,	1u,	0u,	false,	true,	}, "only sparse queue, wait for semaphore(s)", },
		{ "single_queue_wait_many",						{	1u,	3u,	0u,	false,	true,	}, "only sparse queue, wait for semaphore(s)", },
		{ "single_queue_signal_one",					{	1u,	0u,	1u,	false,	true,	}, "only sparse queue, signal semaphore(s)", },
		{ "single_queue_signal_many",					{	1u,	0u,	3u,	false,	true,	}, "only sparse queue, signal semaphore(s)", },
		{ "single_queue_wait_one_signal_one",			{	1u,	1u,	1u,	false,	true,	}, "only sparse queue, wait for and signal semaphore(s)", },
		{ "single_queue_wait_many_signal_many",			{	1u,	2u,	3u,	false,	true,	}, "only sparse queue, wait for and signal semaphore(s)", },

		{ "multi_queue_wait_one",						{	2u,	1u,	0u,	false,	true,	}, "sparse and other queues, wait for semaphore(s)", },
		{ "multi_queue_wait_many",						{	2u,	2u,	0u,	false,	true,	}, "sparse and other queues, wait for semaphore(s)", },
		{ "multi_queue_signal_one",						{	2u,	0u,	1u,	false,	true,	}, "sparse and other queues, signal semaphore(s)", },
		{ "multi_queue_signal_many",					{	2u,	0u,	2u,	false,	true,	}, "sparse and other queues, signal semaphore(s)", },
		{ "multi_queue_wait_one_signal_one",			{	2u,	1u,	1u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s)", },
		{ "multi_queue_wait_many_signal_many",			{	2u,	2u,	2u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s)", },
		{ "multi_queue_wait_one_signal_one_other",		{	2u,	1u,	1u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s) on other queues", },
		{ "multi_queue_wait_many_signal_many_other",	{	3u,	2u,	2u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s) on other queues", },

		{ "empty",										{	1u,	0u,	0u,	true,	false,	}, "call vkQueueBindSparse with zero bindInfos", },
		{ "empty_fence",								{	1u,	0u,	0u,	true,	true,	}, "call vkQueueBindSparse with zero bindInfos, signal a fence", },
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
		group->addChild(new SparseQueueBindTest(group->getTestContext(), cases[caseNdx].name, cases[caseNdx].description, cases[caseNdx].params));
}